

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::~MemoryOutputStream
          (MemoryOutputStream *this)

{
  size_type sVar1;
  string *psVar2;
  undefined8 uVar3;
  char cVar4;
  int iVar5;
  mapped_type *ppbVar6;
  ulong uVar7;
  mapped_type this_00;
  char *pcVar8;
  ostream *poVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  void *__src;
  size_t __n;
  LogMessage *other;
  SubstituteArg *in_stack_fffffffffffffc38;
  bool local_341;
  LogFinisher local_2d2;
  byte local_2d1;
  LogMessage local_2d0;
  size_t local_298;
  size_type line_length;
  char *target_ptr;
  size_type data_pos;
  int i;
  int indent_size;
  string indent_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string *local_230;
  size_type pos;
  SubstituteArg local_1f8;
  SubstituteArg local_1c8;
  SubstituteArg local_198;
  SubstituteArg local_168;
  SubstituteArg local_138;
  SubstituteArg local_108;
  SubstituteArg local_d8;
  SubstituteArg local_a8;
  SubstituteArg local_78;
  undefined1 local_48 [8];
  string magic_string;
  string *target;
  string **map_slot;
  MemoryOutputStream *this_local;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__MemoryOutputStream_006f3588;
  internal::scoped_ptr<google::protobuf::io::StringOutputStream>::reset
            (&this->inner_,(StringOutputStream *)0x0);
  ppbVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
            ::operator[](&this->directory_->files_,&this->filename_);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::__cxx11::string::size();
      pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&this->data_);
      if (*pcVar8 != '\n') {
        std::__cxx11::string::push_back((char)this + 'P');
      }
    }
    if (*ppbVar6 == (mapped_type)0x0) {
      poVar9 = std::operator<<((ostream *)&std::cerr,(string *)&this->filename_);
      poVar9 = std::operator<<(poVar9,": Tried to insert into file that doesn\'t exist.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      this->directory_->had_error_ = true;
    }
    else {
      magic_string.field_2._8_8_ = *ppbVar6;
      strings::internal::SubstituteArg::SubstituteArg(&local_78,&this->insertion_point_);
      strings::internal::SubstituteArg::SubstituteArg(&local_a8);
      strings::internal::SubstituteArg::SubstituteArg(&local_d8);
      strings::internal::SubstituteArg::SubstituteArg(&local_108);
      strings::internal::SubstituteArg::SubstituteArg(&local_138);
      strings::internal::SubstituteArg::SubstituteArg(&local_168);
      strings::internal::SubstituteArg::SubstituteArg(&local_198);
      strings::internal::SubstituteArg::SubstituteArg(&local_1c8);
      strings::internal::SubstituteArg::SubstituteArg(&local_1f8);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&pos);
      strings::Substitute_abi_cxx11_
                ((string *)local_48,(strings *)"@@protoc_insertion_point($0)",(char *)&local_78,
                 &local_a8,&local_d8,&local_108,&local_138,&local_168,&local_198,&local_1c8,
                 &local_1f8,(SubstituteArg *)&pos,in_stack_fffffffffffffc38);
      local_230 = (string *)
                  std::__cxx11::string::find((string *)magic_string.field_2._8_8_,(ulong)local_48);
      if (local_230 == (string *)0xffffffffffffffff) {
        poVar9 = std::operator<<((ostream *)&std::cerr,(string *)&this->filename_);
        poVar9 = std::operator<<(poVar9,": insertion point \"");
        poVar9 = std::operator<<(poVar9,(string *)&this->insertion_point_);
        poVar9 = std::operator<<(poVar9,"\" not found.");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        this->directory_->had_error_ = true;
      }
      else {
        indent_.field_2._M_local_buf[0xf] = '\0';
        local_341 = false;
        if ((string *)0x3 < local_230) {
          std::__cxx11::string::substr((ulong)&local_250,magic_string.field_2._8_8_);
          indent_.field_2._M_local_buf[0xf] = '\x01';
          local_341 = std::operator==(&local_250,"/*");
        }
        if ((indent_.field_2._M_local_buf[0xf] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_250);
        }
        if (local_341 == false) {
          lVar10 = std::__cxx11::string::find_last_of((char)magic_string.field_2._8_8_,10);
          if (lVar10 == -1) {
            local_230 = (string *)0x0;
          }
          else {
            local_230 = (string *)(lVar10 + 1);
          }
        }
        else {
          local_230 = local_230 + -3;
        }
        uVar3 = magic_string.field_2._8_8_;
        psVar2 = local_230;
        lVar10 = std::__cxx11::string::find_first_not_of
                           ((char *)magic_string.field_2._8_8_,0x5ce5a0);
        std::__cxx11::string::string
                  ((string *)&i,(string *)uVar3,(ulong)psVar2,lVar10 - (long)local_230);
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          data_pos._4_4_ = 0;
          for (data_pos._0_4_ = 0; uVar7 = (ulong)(int)data_pos,
              uVar11 = std::__cxx11::string::size(), uVar3 = magic_string.field_2._8_8_,
              psVar2 = local_230, uVar7 < uVar11; data_pos._0_4_ = (int)data_pos + 1) {
            pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&this->data_);
            if (*pcVar8 == '\n') {
              iVar5 = std::__cxx11::string::size();
              data_pos._4_4_ = data_pos._4_4_ + iVar5;
            }
          }
          cVar4 = std::__cxx11::string::size();
          std::__cxx11::string::insert(uVar3,(ulong)psVar2,cVar4 + (char)data_pos._4_4_);
          target_ptr = (char *)0x0;
          pcVar8 = string_as_array((string *)magic_string.field_2._8_8_);
          line_length = (size_type)(pcVar8 + (long)local_230);
          for (; pcVar8 = target_ptr, pcVar12 = (char *)std::__cxx11::string::size(),
              sVar1 = line_length, pcVar8 < pcVar12; target_ptr = target_ptr + local_298) {
            __src = (void *)std::__cxx11::string::data();
            __n = std::__cxx11::string::size();
            memcpy((void *)sVar1,__src,__n);
            lVar10 = std::__cxx11::string::size();
            line_length = lVar10 + line_length;
            lVar10 = std::__cxx11::string::find_first_of((char)this + 'P',10);
            sVar1 = line_length;
            local_298 = (lVar10 + 1) - (long)target_ptr;
            lVar10 = std::__cxx11::string::data();
            memcpy((void *)sVar1,target_ptr + lVar10,local_298);
            line_length = local_298 + line_length;
          }
          local_2d1 = 0;
          pcVar8 = string_as_array((string *)magic_string.field_2._8_8_);
          pcVar8 = pcVar8 + (long)local_230;
          lVar10 = std::__cxx11::string::size();
          if ((char *)sVar1 != pcVar8 + data_pos._4_4_ + lVar10) {
            internal::LogMessage::LogMessage
                      (&local_2d0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x2cc);
            local_2d1 = 1;
            other = internal::LogMessage::operator<<
                              (&local_2d0,
                               "CHECK failed: (target_ptr) == (string_as_array(target) + pos + data_.size() + indent_size): "
                              );
            internal::LogFinisher::operator=(&local_2d2,other);
          }
          if ((local_2d1 & 1) != 0) {
            internal::LogMessage::~LogMessage(&local_2d0);
          }
        }
        else {
          std::__cxx11::string::insert(magic_string.field_2._8_8_,local_230);
        }
        std::__cxx11::string::~string((string *)&i);
      }
      std::__cxx11::string::~string((string *)local_48);
    }
  }
  else if (*ppbVar6 == (mapped_type)0x0) {
    this_00 = (mapped_type)operator_new(0x20);
    std::__cxx11::string::string((string *)this_00);
    *ppbVar6 = this_00;
    std::__cxx11::string::swap((string *)*ppbVar6);
  }
  else if ((this->append_mode_ & 1U) == 0) {
    poVar9 = std::operator<<((ostream *)&std::cerr,(string *)&this->filename_);
    poVar9 = std::operator<<(poVar9,": Tried to write the same file twice.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    this->directory_->had_error_ = true;
  }
  else {
    std::__cxx11::string::append((string *)*ppbVar6);
  }
  internal::scoped_ptr<google::protobuf::io::StringOutputStream>::~scoped_ptr(&this->inner_);
  std::__cxx11::string::~string((string *)&this->data_);
  std::__cxx11::string::~string((string *)&this->insertion_point_);
  std::__cxx11::string::~string((string *)&this->filename_);
  io::ZeroCopyOutputStream::~ZeroCopyOutputStream(&this->super_ZeroCopyOutputStream);
  return;
}

Assistant:

CommandLineInterface::MemoryOutputStream::~MemoryOutputStream() {
  // Make sure all data has been written.
  inner_.reset();

  // Insert into the directory.
  string** map_slot = &directory_->files_[filename_];

  if (insertion_point_.empty()) {
    // This was just a regular Open().
    if (*map_slot != NULL) {
      if (append_mode_) {
        (*map_slot)->append(data_);
      } else {
        std::cerr << filename_ << ": Tried to write the same file twice."
                  << std::endl;
        directory_->had_error_ = true;
      }
      return;
    }

    *map_slot = new string;
    (*map_slot)->swap(data_);
  } else {
    // This was an OpenForInsert().

    // If the data doesn't end with a clean line break, add one.
    if (!data_.empty() && data_[data_.size() - 1] != '\n') {
      data_.push_back('\n');
    }

    // Find the file we are going to insert into.
    if (*map_slot == NULL) {
      std::cerr << filename_
                << ": Tried to insert into file that doesn't exist."
                << std::endl;
      directory_->had_error_ = true;
      return;
    }
    string* target = *map_slot;

    // Find the insertion point.
    string magic_string = strings::Substitute(
        "@@protoc_insertion_point($0)", insertion_point_);
    string::size_type pos = target->find(magic_string);

    if (pos == string::npos) {
      std::cerr << filename_ << ": insertion point \"" << insertion_point_
                << "\" not found." << std::endl;
      directory_->had_error_ = true;
      return;
    }

    if ((pos > 3) && (target->substr(pos - 3, 2) == "/*")) {
      // Support for inline "/* @@protoc_insertion_point() */"
      pos = pos - 3;
    } else {
      // Seek backwards to the beginning of the line, which is where we will
      // insert the data.  Note that this has the effect of pushing the
      // insertion point down, so the data is inserted before it.  This is
      // intentional because it means that multiple insertions at the same point
      // will end up in the expected order in the final output.
      pos = target->find_last_of('\n', pos);
      if (pos == string::npos) {
        // Insertion point is on the first line.
        pos = 0;
      } else {
        // Advance to character after '\n'.
        ++pos;
      }
    }

    // Extract indent.
    string indent_(*target, pos, target->find_first_not_of(" \t", pos) - pos);

    if (indent_.empty()) {
      // No indent.  This makes things easier.
      target->insert(pos, data_);
    } else {
      // Calculate how much space we need.
      int indent_size = 0;
      for (int i = 0; i < data_.size(); i++) {
        if (data_[i] == '\n') indent_size += indent_.size();
      }

      // Make a hole for it.
      target->insert(pos, data_.size() + indent_size, '\0');

      // Now copy in the data.
      string::size_type data_pos = 0;
      char* target_ptr = string_as_array(target) + pos;
      while (data_pos < data_.size()) {
        // Copy indent.
        memcpy(target_ptr, indent_.data(), indent_.size());
        target_ptr += indent_.size();

        // Copy line from data_.
        // We already guaranteed that data_ ends with a newline (above), so this
        // search can't fail.
        string::size_type line_length =
            data_.find_first_of('\n', data_pos) + 1 - data_pos;
        memcpy(target_ptr, data_.data() + data_pos, line_length);
        target_ptr += line_length;
        data_pos += line_length;
      }

      GOOGLE_CHECK_EQ(target_ptr,
          string_as_array(target) + pos + data_.size() + indent_size);
    }
  }
}